

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEditPrivate::~QTextEditPrivate(QTextEditPrivate *this)

{
  array<QMetaObject::Connection,_13UL> *this_00;
  QAbstractScrollAreaPrivate *in_RDI;
  Connection *connection;
  iterator __end1;
  iterator __begin1;
  array<QMetaObject::Connection,_13UL> *__range1;
  array<QMetaObject::Connection,_13UL> *local_18;
  
  *(undefined ***)&(in_RDI->super_QFramePrivate).super_QWidgetPrivate =
       &PTR__QTextEditPrivate_00d1da00;
  local_18 = (array<QMetaObject::Connection,_13UL> *)
             std::array<QMetaObject::Connection,_13UL>::begin
                       ((array<QMetaObject::Connection,_13UL> *)0x6ced29);
  this_00 = (array<QMetaObject::Connection,_13UL> *)
            std::array<QMetaObject::Connection,_13UL>::end
                      ((array<QMetaObject::Connection,_13UL> *)0x6ced38);
  for (; local_18 != this_00;
      local_18 = (array<QMetaObject::Connection,_13UL> *)&local_18->field_0x8) {
    QObject::disconnect((Connection *)local_18);
  }
  std::array<QMetaObject::Connection,_13UL>::~array(this_00);
  QString::~QString((QString *)0x6ced9e);
  QString::~QString((QString *)0x6cedaf);
  QBasicTimer::~QBasicTimer((QBasicTimer *)in_RDI);
  QAbstractScrollAreaPrivate::~QAbstractScrollAreaPrivate(in_RDI);
  return;
}

Assistant:

QTextEditPrivate::~QTextEditPrivate()
{
    for (const QMetaObject::Connection &connection : connections)
        QObject::disconnect(connection);
}